

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O0

bool __thiscall CCNR::ls_solver::build_instance(ls_solver *this,string *inst)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  istream *piVar4;
  reference piVar5;
  reference plVar6;
  long in_RDI;
  lit item_2;
  iterator __end2;
  iterator __begin2;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *__range2;
  int item_1;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  int item;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  ifstream fin;
  vector<int,_std::allocator<int>_> temp_clause;
  string tempstr2;
  string tempstr1;
  bool clause_tautology;
  bool lit_redundent;
  int cur_lit;
  size_t v;
  size_t c;
  istringstream iss;
  string line;
  ls_solver *in_stack_fffffffffffffa68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa70;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffa78;
  undefined7 in_stack_fffffffffffffa80;
  undefined1 in_stack_fffffffffffffa87;
  __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_> local_520;
  reference local_518;
  undefined1 local_510 [24];
  lit local_4f8;
  int local_4e4;
  int *local_4e0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_4d8;
  ls_solver *in_stack_fffffffffffffb30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_4b8;
  undefined1 *local_4b0;
  vector<int,_std::allocator<int>_> local_4a8;
  string local_488 [32];
  string local_468 [36];
  undefined4 local_444;
  istream local_440 [520];
  undefined1 local_238 [56];
  string local_200 [34];
  byte local_1de;
  byte local_1dd;
  int local_1dc;
  size_type local_1d8;
  pointer local_1d0;
  pointer local_1b8 [48];
  string local_38 [55];
  byte local_1;
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b8);
  std::__cxx11::string::string(local_200);
  std::__cxx11::string::string((string *)(local_238 + 0x18));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16419c);
  uVar3 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_440,uVar3,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    local_1 = 0;
  }
  else {
    do {
      do {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_440,local_38);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
        if (!bVar2) goto LAB_0016442c;
        std::__cxx11::string::substr((ulong)local_468,(ulong)local_38);
        bVar2 = std::operator==(in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
        std::__cxx11::string::~string(local_468);
      } while (bVar2);
      std::__cxx11::string::substr((ulong)local_488,(ulong)local_38);
      bVar2 = std::operator==(in_stack_fffffffffffffa70,(char *)in_stack_fffffffffffffa68);
      std::__cxx11::string::~string(local_488);
    } while (!bVar2);
    std::ios::clear((long)local_1b8 + *(long *)(local_1b8[0] + -6),0);
    std::__cxx11::istringstream::str((string *)local_1b8);
    std::istream::seekg((long)local_1b8,_S_beg);
    piVar4 = std::operator>>((istream *)local_1b8,local_200);
    piVar4 = std::operator>>(piVar4,(string *)(local_238 + 0x18));
    piVar4 = (istream *)std::istream::operator>>(piVar4,(ulong *)(in_RDI + 0x50));
    std::istream::operator>>(piVar4,(ulong *)(in_RDI + 0x58));
LAB_0016442c:
    in_stack_fffffffffffffa87 = make_space(in_stack_fffffffffffffa68);
    if ((bool)in_stack_fffffffffffffa87) {
      local_1d0 = (pointer)0x0;
      while (local_1d0 < *(pointer *)(in_RDI + 0x58)) {
        local_1de = 0;
        in_stack_fffffffffffffa70 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238;
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x16449b)
        ;
        local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_4a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        in_stack_fffffffffffffa78 = &local_4a8;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x1644c4);
        std::vector<int,_std::allocator<int>_>::swap
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                   in_stack_fffffffffffffa78);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
        std::istream::operator>>(local_440,&local_1dc);
        while (local_1dc != 0) {
          if ((local_1de & 1) == 0) {
            local_1dd = 0;
            local_4b0 = local_238;
            local_4b8._M_current =
                 (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa68);
            std::vector<int,_std::allocator<int>_>::end
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa68);
            while (bVar2 = __gnu_cxx::operator!=
                                     ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)in_stack_fffffffffffffa70,
                                      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)in_stack_fffffffffffffa68), bVar2) {
              piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&local_4b8);
              if (local_1dc == *piVar5) {
                local_1dd = 1;
                break;
              }
              if (local_1dc == -*piVar5) {
                local_1de = 1;
                break;
              }
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&local_4b8);
            }
            if ((local_1dd & 1) == 0) {
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                         (value_type_conflict1 *)in_stack_fffffffffffffa78);
            }
          }
          std::istream::operator>>(local_440,&local_1dc);
        }
        if ((local_1de & 1) == 0) {
          in_stack_fffffffffffffb30 = (ls_solver *)local_238;
          local_4d8._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa68);
          local_4e0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                       ((vector<int,_std::allocator<int>_> *)
                                        in_stack_fffffffffffffa68);
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)in_stack_fffffffffffffa70,
                                    (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)in_stack_fffffffffffffa68), bVar2) {
            piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_4d8);
            local_4e4 = *piVar5;
            in_stack_fffffffffffffa68 =
                 (ls_solver *)
                 std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                           ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)(in_RDI + 0x38),
                            (size_type)local_1d0);
            lit::lit(&local_4f8,local_4e4,(int)local_1d0);
            std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::push_back
                      ((vector<CCNR::lit,_std::allocator<CCNR::lit>_> *)in_stack_fffffffffffffa70,
                       (value_type *)in_stack_fffffffffffffa68);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&local_4d8);
          }
          local_1d0 = (pointer)((long)local_1d0 + 1);
        }
        else {
          *(long *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x58) + -1;
          std::vector<int,_std::allocator<int>_>::clear
                    ((vector<int,_std::allocator<int>_> *)0x16471c);
          memset(local_510,0,0x18);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)0x16473d);
          std::vector<int,_std::allocator<int>_>::swap
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                     in_stack_fffffffffffffa78);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
        }
      }
      std::ifstream::close();
      for (local_1d0 = (pointer)0x0; local_1d0 < *(pointer *)(in_RDI + 0x58);
          local_1d0 = (pointer)((long)local_1d0 + 1)) {
        local_518 = std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                              ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)
                               (in_RDI + 0x38),(size_type)local_1d0);
        local_520._M_current =
             (lit *)std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::begin
                              ((vector<CCNR::lit,_std::allocator<CCNR::lit>_> *)
                               in_stack_fffffffffffffa68);
        std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::end
                  ((vector<CCNR::lit,_std::allocator<CCNR::lit>_> *)in_stack_fffffffffffffa68);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                                   *)in_stack_fffffffffffffa70,
                                  (__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                                   *)in_stack_fffffffffffffa68), bVar2) {
          plVar6 = __gnu_cxx::
                   __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                   ::operator*(&local_520);
          local_1d8 = plVar6->var_num;
          std::vector<CCNR::variable,_std::allocator<CCNR::variable>_>::operator[]
                    ((vector<CCNR::variable,_std::allocator<CCNR::variable>_> *)(in_RDI + 0x20),
                     local_1d8);
          std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::push_back
                    ((vector<CCNR::lit,_std::allocator<CCNR::lit>_> *)
                     CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
                     (value_type *)in_stack_fffffffffffffa78);
          __gnu_cxx::
          __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>::
          operator++(&local_520);
        }
      }
      build_neighborhood(in_stack_fffffffffffffb30);
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
  local_444 = 1;
  std::ifstream::~ifstream(local_440);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80));
  std::__cxx11::string::~string((string *)(local_238 + 0x18));
  std::__cxx11::string::~string(local_200);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b8);
  std::__cxx11::string::~string(local_38);
  return (bool)(local_1 & 1);
}

Assistant:

bool ls_solver::build_instance(string inst)
{
    string line;
    istringstream iss;
    size_t c, v;
    int cur_lit;
    bool lit_redundent, clause_tautology;
    string tempstr1, tempstr2;
    vector<int> temp_clause;
    ifstream fin(inst.c_str());
    if (!fin.is_open()) return false;
    while (getline(fin, line)) {
        if (line.substr(0, 1) == "c")
            continue;
        else if (line.substr(0, 1) == "p") {
            // reassign_istringstream(iss, line);
            iss.clear();
            iss.str(line);
            iss.seekg(0, ios::beg);
            iss >> tempstr1 >> tempstr2 >> _num_vars >> _num_clauses;
            break;
        }
    }
    if (!make_space()) return false;
    // read clauses, each at a time
    for (c = 0; c < _num_clauses;) {
        clause_tautology = false;
        temp_clause.clear();
        vector<int>().swap(temp_clause);
        fin >> cur_lit;
        while (cur_lit != 0) {
            if (!clause_tautology) {
                lit_redundent = false;
                for (int item : temp_clause) {
                    if (cur_lit == item) {
                        lit_redundent = true;
                        break;
                    } else if (cur_lit == -item) {
                        clause_tautology = true;
                        break;
                    }
                }
                if (!lit_redundent) {
                    temp_clause.push_back(cur_lit);
                }
            }
            fin >> cur_lit;
        }
        if (!clause_tautology) {
            for (int item : temp_clause) {
                _clauses[c].literals.push_back(lit(item, c));
            }
            c++;
        } else {
            _num_clauses--;
            temp_clause.clear();
            vector<int>().swap(temp_clause);
        }
    }
    fin.close();
    /********finish reading the input file****************/
    // build variables data structure
    for (c = 0; c < _num_clauses; c++) {
        for (lit item : _clauses[c].literals) {
            v = item.var_num;
            _vars[v].literals.push_back(item);
        }
    }
    build_neighborhood();
    return true;
}